

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker_base.hpp
# Opt level: O2

void __thiscall oqpi::worker_config::worker_config(worker_config *this)

{
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"oqpi::worker",&local_31);
  std::__cxx11::string::string((string *)this,local_30);
  (this->threadAttributes).stackSize_ = 0;
  (this->threadAttributes).coreAffinityMask_ = all_cores;
  (this->threadAttributes).priority_ = normal;
  std::__cxx11::string::~string(local_30);
  this->workerPrio = wprio_any;
  this->count = 1;
  return;
}

Assistant:

worker_config()
            : threadAttributes("oqpi::worker")
            , workerPrio(worker_priority::wprio_any)
            , count(1)
        {}